

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock::ResonanceParameters::
     verifySize(int NPL,int NX)

{
  undefined8 *puVar1;
  char *args;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>("Encountered empty list");
    args = "NPL should be larger than zero and equal to 6 * NX";
  }
  else {
    if (((uint)(NPL * -0x55555555) >> 1 | (uint)((NPL * -0x55555555 & 1U) != 0) << 0x1f) <
        0x2aaaaaab) {
      return;
    }
    tools::Log::error<char_const*>("Encountered inconsistent list size");
    args = "NPL must be equal to 6 * NX";
  }
  tools::Log::info<char_const*>(args);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
  tools::Log::info<char_const*,int>("NX value: {}",NX);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NX ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to 6 * NX" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NX value: {}", NX );
    throw std::exception();
  }

  if ( NPL % 6 != 0 ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to 6 * NX" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NX value: {}", NX );
    throw std::exception();
  }
}